

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall pbrt::Sphere::Sphere(Sphere *this,SP *material)

{
  SP local_20;
  
  local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Shape::Shape(&this->super_Shape,&local_20);
  if (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_Shape).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00167908;
  (this->transform).l.vx.x = 1.0;
  (this->transform).l.vx.y = 0.0;
  *(undefined8 *)&(this->transform).l.vx.z = 0;
  (this->transform).l.vy.y = 1.0;
  (this->transform).l.vy.z = 0.0;
  (this->transform).l.vz.x = 0.0;
  (this->transform).l.vz.y = 0.0;
  *(undefined8 *)&(this->transform).l.vz.z = 0x3f800000;
  (this->transform).p.y = 0.0;
  (this->transform).p.z = 0.0;
  this->radius = 1.0;
  return;
}

Assistant:

Sphere(Material::SP material=Material::SP()) : Shape(material) {}